

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.h
# Opt level: O0

shared_ptr<cppcms::application_specific_pool> cppcms::create_pool<sender,pools*>(pools *p)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)> *in_RDI;
  shared_ptr<cppcms::application_specific_pool> sVar1;
  type functor;
  shared_ptr<cppcms::application_specific_pool> *f;
  simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
  *in_stack_ffffffffffffff78;
  _Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)> *call;
  simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
  *this;
  
  this = (simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
          *)&stack0xffffffffffffffe0;
  call = in_RDI;
  std::bind<sender*(*)(cppcms::service&,pools*),std::_Placeholder<1>const&,pools*&>
            (&in_RDI->_M_f,(_Placeholder<1> *)in_RDI,(pools **)in_stack_ffffffffffffff78);
  operator_new(0x30);
  std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>::_Bind
            (in_RDI,(_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)> *
                    )in_stack_ffffffffffffff78);
  details::
  simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
  ::simple_application_specific_pool1(this,call);
  std::shared_ptr<cppcms::application_specific_pool>::
  shared_ptr<cppcms::details::simple_application_specific_pool1<sender,std::_Bind<sender*(*(std::_Placeholder<1>,pools*))(cppcms::service&,pools*)>>,void>
            ((shared_ptr<cppcms::application_specific_pool> *)in_RDI,in_stack_ffffffffffffff78);
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)call;
  return (shared_ptr<cppcms::application_specific_pool>)
         sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<application_specific_pool> create_pool(P...p)
	{
        auto functor = std::bind(&details::create_app<T,P...>,std::placeholders::_1,p...);
        typedef details::simple_application_specific_pool1<T,decltype(functor)> pool_type;
		booster::shared_ptr<application_specific_pool> f(new pool_type(std::move(functor)));
		return f;
	}